

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token_iterator.hpp
# Opt level: O3

bool __thiscall
boost::unit_test::utils::ut_detail::
delim_policy<char,_boost::unit_test::utils::ut_detail::default_char_compare<char>_>::operator()
          (delim_policy<char,_boost::unit_test::utils::ut_detail::default_char_compare<char>_> *this
          ,char c)

{
  ti_delimeter_type tVar1;
  char *pcVar2;
  char *pcVar3;
  int iVar4;
  char *pcVar5;
  bool bVar6;
  
  tVar1 = this->m_type;
  if (tVar1 == dt_isspace) {
    iVar4 = isspace((int)c);
  }
  else {
    if (tVar1 != dt_ispunct) {
      if (tVar1 == dt_char) {
        pcVar2 = (this->m_delimeters).m_begin;
        pcVar3 = (this->m_delimeters).m_end;
        if (pcVar2 != pcVar3) {
          do {
            pcVar5 = pcVar2 + 1;
            bVar6 = *pcVar2 == c;
            if (bVar6) {
              return bVar6;
            }
            pcVar2 = pcVar5;
          } while (pcVar5 != pcVar3);
          return bVar6;
        }
      }
      return false;
    }
    iVar4 = ispunct((int)c);
  }
  return iVar4 != 0;
}

Assistant:

bool        operator()( CharT c )
    {
        switch( m_type ) {
        case dt_char: {
            BOOST_TEST_FOREACH( CharT, delim, m_delimeters )
                if( CharCompare()( delim, c ) )
                    return true;

            return false;
        }
        case dt_ispunct:
            return (std::ispunct)( c ) != 0;
        case dt_isspace:
            return (std::isspace)( c ) != 0;
        case dt_none:
            return false;
        }

        return false;
    }